

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int redisAsyncCommandArgv
              (redisAsyncContext *ac,redisCallbackFn *fn,void *privdata,int argc,char **argv,
              size_t *argvlen)

{
  int iVar1;
  int status;
  int len;
  sds cmd;
  size_t *argvlen_local;
  char **argv_local;
  void *pvStack_28;
  int argc_local;
  void *privdata_local;
  redisCallbackFn *fn_local;
  redisAsyncContext *ac_local;
  
  cmd = (sds)argvlen;
  argvlen_local = (size_t *)argv;
  argv_local._4_4_ = argc;
  pvStack_28 = privdata;
  privdata_local = fn;
  fn_local = (redisCallbackFn *)ac;
  pthread_mutex_lock((pthread_mutex_t *)&ac->ctxlock);
  iVar1 = redisFormatSdsCommandArgv
                    ((sds *)&status,argv_local._4_4_,(char **)argvlen_local,(size_t *)cmd);
  if (iVar1 < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(fn_local + 0xf0));
    ac_local._4_4_ = -1;
  }
  else {
    iVar1 = __redisAsyncCommand((redisAsyncContext *)fn_local,(redisCallbackFn *)privdata_local,
                                pvStack_28,_status,(long)iVar1);
    sdsfree(_status);
    pthread_mutex_unlock((pthread_mutex_t *)(fn_local + 0xf0));
    ac_local._4_4_ = iVar1;
  }
  return ac_local._4_4_;
}

Assistant:

int redisAsyncCommandArgv(redisAsyncContext *ac, redisCallbackFn *fn, void *privdata, int argc, const char **argv, const size_t *argvlen) {
    pthread_mutex_lock(&ac->ctxlock);
    sds cmd;
    int len;
    int status;
    len = redisFormatSdsCommandArgv(&cmd,argc,argv,argvlen);
    if (len < 0){
        pthread_mutex_unlock(&ac->ctxlock);
        return REDIS_ERR;
    }

    status = __redisAsyncCommand(ac,fn,privdata,cmd,len);
    sdsfree(cmd);
    pthread_mutex_unlock(&ac->ctxlock);
    return status;
}